

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O2

c_v64 c_v64_ssub_u16(c_v64 a,c_v64 b)

{
  long lVar1;
  undefined2 uVar2;
  int iVar3;
  c_v64 b_local;
  c_v64 a_local;
  c_v64 t;
  
  a_local = a;
  b_local = b;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    iVar3 = (uint)*(ushort *)((long)&a_local + lVar1 * 2) -
            (uint)*(ushort *)((long)&b_local + lVar1 * 2);
    uVar2 = (undefined2)iVar3;
    if (iVar3 < 1) {
      uVar2 = 0;
    }
    *(undefined2 *)((long)&t + lVar1 * 2) = uVar2;
  }
  return (c_v64)t.u64;
}

Assistant:

SIMD_INLINE c_v64 c_v64_ssub_u16(c_v64 a, c_v64 b) {
  c_v64 t;
  int c;
  for (c = 0; c < 4; c++)
    t.u16[c] =
        (int32_t)a.u16[c] - (int32_t)b.u16[c] < 0 ? 0 : a.u16[c] - b.u16[c];
  return t;
}